

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

iterator __thiscall Json::Value::end(Value *this)

{
  long lVar1;
  undefined8 in_RDX;
  long *in_RSI;
  double dVar2;
  bool bVar3;
  iterator iVar4;
  
  bVar3 = (*(ushort *)(in_RSI + 1) & 0xfe) != 6;
  lVar1 = *in_RSI;
  iVar4.super_ValueIteratorBase._9_7_ = (undefined7)((ulong)in_RDX >> 8);
  iVar4.super_ValueIteratorBase.isNull_ = lVar1 == 0 || bVar3;
  dVar2 = 0.0;
  if (lVar1 != 0 && !bVar3) {
    dVar2 = (double)(lVar1 + 8);
  }
  (this->value_).real_ = dVar2;
  this->field_0x8 = iVar4.super_ValueIteratorBase.isNull_;
  iVar4.super_ValueIteratorBase.current_._M_node = (_Base_ptr)this;
  return (iterator)iVar4.super_ValueIteratorBase;
}

Assistant:

Value::iterator
Value::end ()
{
    switch ( type_ )
    {
    case arrayValue:
    case objectValue:
        if ( value_.map_ )
            return iterator ( value_.map_->end () );
        break;
    default:
        break;
    }

    return iterator ();
}